

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_port.cc
# Opt level: O1

int raptor::JoinHostPort(UniquePtr<char> *out,char *host,int port)

{
  int iVar1;
  pointer in_RAX;
  char *pcVar2;
  char *tmp;
  pointer local_28;
  
  local_28 = in_RAX;
  if (*host != '[') {
    pcVar2 = strchr(host,0x3a);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = "[%s]:%d";
      goto LAB_0010c852;
    }
  }
  pcVar2 = "%s:%d";
LAB_0010c852:
  iVar1 = raptor_asprintf(&local_28,pcVar2,host,(ulong)(uint)port);
  std::__uniq_ptr_impl<char,_raptor::DefaultDeleteChar>::reset
            ((__uniq_ptr_impl<char,_raptor::DefaultDeleteChar> *)out,local_28);
  return iVar1;
}

Assistant:

int JoinHostPort(UniquePtr<char>* out, const char* host, int port) {
    char* tmp;
    int ret;
    if (host[0] != '[' && strchr(host, ':') != nullptr) {
        /* IPv6 literals must be enclosed in brackets. */
        ret = raptor_asprintf(&tmp, "[%s]:%d", host, port);
    } else {
        /* Ordinary non-bracketed host:port. */
        ret = raptor_asprintf(&tmp, "%s:%d", host, port);
    }
    out->reset(tmp);
    return ret;
}